

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

intptr_t sysbvm_dictionary_scanFor
                   (sysbvm_context_t *context,sysbvm_dictionary_t **dictionary,
                   sysbvm_tuple_t *element)

{
  uint uVar1;
  sysbvm_array_t *psVar2;
  _Bool _Var3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  ulong uStack_60;
  anon_struct_16_2_ceb630cf gcFrame;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&gcFrame;
  gcFrame.storage = (sysbvm_array_t *)0x0;
  gcFrame.association = (sysbvm_association_t *)0x0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  sysbvm_stackFrame_pushRecord(&local_48);
  psVar2 = (sysbvm_array_t *)(*dictionary)->storage;
  uVar7 = 0xffffffffffffffff;
  if ((((ulong)psVar2 & 0xf) == 0 && psVar2 != (sysbvm_array_t *)0x0) &&
     (uVar1 = (psVar2->header).objectSize, 7 < uVar1)) {
    uVar6 = (ulong)(uVar1 >> 3);
    gcFrame.storage = psVar2;
    sVar4 = sysbvm_tuple_hash(context,*element);
    uVar5 = sVar4 % uVar6;
    for (uVar7 = uVar5; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      gcFrame.association = (sysbvm_association_t *)(gcFrame.storage)->elements[uVar7];
      if (gcFrame.association == (sysbvm_association_t *)0x0) goto LAB_0011282c;
      _Var3 = sysbvm_tuple_equals(context,*element,(gcFrame.association)->key);
      if (_Var3) goto LAB_0011282c;
    }
    uStack_60 = 0xffffffffffffffff;
    for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      gcFrame.association = (sysbvm_association_t *)(gcFrame.storage)->elements[uVar7];
      if (gcFrame.association == (sysbvm_association_t *)0x0) goto LAB_0011282c;
      _Var3 = sysbvm_tuple_equals(context,*element,(gcFrame.association)->key);
      if (_Var3) goto LAB_0011282c;
    }
  }
  else {
LAB_0011282c:
    uStack_60 = uVar7;
    sysbvm_stackFrame_popRecord(&local_48);
  }
  return uStack_60;
}

Assistant:

static intptr_t sysbvm_dictionary_scanFor(sysbvm_context_t *context, sysbvm_dictionary_t **dictionary, sysbvm_tuple_t *element)
{
    struct {
        sysbvm_array_t *storage;
        sysbvm_association_t *association;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t capacity = sysbvm_tuple_getSizeInSlots((*dictionary)->storage);
    if(capacity == 0)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return -1;
    }

    gcFrame.storage = (sysbvm_array_t*)(*dictionary)->storage;
    size_t hashIndex = sysbvm_tuple_hash(context, *element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        gcFrame.association = (sysbvm_association_t*)gcFrame.storage->elements[i];
        if(!gcFrame.association ||
            sysbvm_tuple_equals(context, *element, gcFrame.association->key))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (intptr_t)i;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        gcFrame.association = (sysbvm_association_t*)gcFrame.storage->elements[i];
        if(!gcFrame.association ||
            sysbvm_tuple_equals(context, *element, gcFrame.association->key))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (intptr_t)i;
        }
    }

    return -1;
}